

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_innerproduct_activation(NetOptimize *this)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  long *plVar4;
  value_type pLVar5;
  FILE *__stream;
  bool bVar6;
  reference ppLVar7;
  reference pvVar8;
  size_type sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool *pbVar12;
  reference pvVar13;
  long in_RDI;
  int top_blob_index_final;
  HardSwish *hardswish;
  Clip *clip;
  ReLU *relu;
  Layer *activation;
  InnerProduct *innerproduct;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  char *in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  Allocator *in_stack_fffffffffffffc18;
  Mat *in_stack_fffffffffffffc20;
  bool *in_stack_fffffffffffffc28;
  Mat *in_stack_fffffffffffffc30;
  Mat local_350;
  value_type local_308;
  void *local_300;
  int *local_2f8;
  undefined8 local_2f0;
  undefined4 local_2e8;
  long *local_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined8 local_2c0;
  value_type local_2b8;
  void *local_2a0;
  int *local_298;
  undefined8 local_290;
  undefined4 local_288;
  long *local_280;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_268;
  undefined8 local_260;
  value_type local_258;
  value_type local_250;
  value_type local_248;
  size_type local_240;
  value_type local_234;
  size_type local_230;
  ulong local_228;
  void **local_218;
  void **local_208;
  Mat *local_1f8;
  int local_1e8;
  undefined4 local_1e4;
  Mat *local_1e0;
  bool *local_1d8;
  bool *local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  bool *local_1b8;
  bool *local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  bool *local_198;
  bool *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined4 local_174;
  void **local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 local_154;
  void **local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined4 local_134;
  Mat *local_130;
  undefined8 local_128;
  bool *local_120;
  undefined8 local_118;
  bool *local_110;
  undefined8 local_108;
  bool *local_100;
  undefined8 local_f8;
  bool *local_f0;
  undefined8 local_e8;
  bool *local_e0;
  int local_d8;
  undefined4 local_d4;
  bool *local_d0;
  int local_c8;
  undefined4 local_c4;
  bool *local_c0;
  int local_b8;
  undefined4 local_b4;
  bool *local_b0;
  int local_98;
  undefined4 local_94;
  Mat *local_90;
  int local_78;
  undefined4 local_74;
  void **local_70;
  int local_58;
  undefined4 local_54;
  void **local_50;
  void *local_48;
  void *local_38;
  void *local_28;
  void *local_18;
  void *local_10;
  void *local_8;
  
  local_228 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58))
  ;
  local_230 = 0;
  do {
    if (local_228 <= local_230) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_230)
    ;
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                            in_stack_fffffffffffffc08);
    if (!bVar6) {
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_230);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
      local_234 = *pvVar8;
      local_240 = local_230;
LAB_00146ba2:
      do {
        do {
          local_240 = local_240 + 1;
          if (local_228 <= local_240) goto LAB_00146d38;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_240);
          bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                  in_stack_fffffffffffffc08);
          if (bVar6) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_240);
            bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                                    ,in_stack_fffffffffffffc08);
            if (bVar6) {
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_240);
              bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffc14,
                                                  in_stack_fffffffffffffc10),
                                      in_stack_fffffffffffffc08);
              if (bVar6) {
                std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_240);
                bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffc14,
                                                    in_stack_fffffffffffffc10),
                                        in_stack_fffffffffffffc08);
                if (bVar6) {
                  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_240);
                  bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_fffffffffffffc14,
                                                      in_stack_fffffffffffffc10),
                                          in_stack_fffffffffffffc08);
                  if (bVar6) goto LAB_00146ba2;
                }
              }
            }
          }
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_240);
          sVar9 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
        } while (sVar9 != 1);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_240);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
      } while (*pvVar8 != local_234);
LAB_00146d38:
      if (local_240 != local_228) {
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_230);
        local_248 = *ppLVar7;
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_240);
        __stream = _stderr;
        local_250 = *ppLVar7;
        uVar10 = std::__cxx11::string::c_str();
        uVar11 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_innerproduct_activation %s %s\n",uVar10,uVar11);
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                in_stack_fffffffffffffc08);
        if (bVar6) {
          local_258 = local_250;
          if ((*(float *)&local_250[1]._vptr_Layer != 0.0) ||
             (NAN(*(float *)&local_250[1]._vptr_Layer))) {
            local_248[1].support_tensor_storage = true;
            local_248[1].support_reserved_00 = false;
            local_248[1].support_reserved_0 = false;
            local_248[1].support_reserved_1 = false;
            local_170 = &local_2a0;
            local_174 = 1;
            local_180 = 4;
            local_188 = 0;
            local_2a0 = (void *)0x0;
            local_298 = (int *)0x0;
            local_290 = 0;
            local_288 = 0;
            local_280 = (long *)0x0;
            local_278 = 0;
            local_274 = 0;
            local_270 = 0;
            local_26c = 0;
            local_268 = 0;
            local_260 = 0;
            ncnn::Mat::create(in_stack_fffffffffffffc30,
                              (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                              (size_t)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            pLVar5 = local_248;
            pbVar12 = &local_248[1].support_reserved_6;
            local_1a0 = &local_2a0;
            local_198 = pbVar12;
            if ((void **)pbVar12 != local_1a0) {
              if (local_298 != (int *)0x0) {
                local_1a4 = 1;
                LOCK();
                local_1a8 = *local_298;
                *local_298 = *local_298 + 1;
                UNLOCK();
              }
              local_d0 = pbVar12;
              if (local_248[1].userdata != (void *)0x0) {
                piVar2 = (int *)local_248[1].userdata;
                local_d4 = 0xffffffff;
                LOCK();
                local_d8 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (local_d8 == 1) {
                  if (local_248[1].type._M_string_length == 0) {
                    local_8 = *(void **)pbVar12;
                    if (local_8 != (void *)0x0) {
                      free(local_8);
                    }
                  }
                  else {
                    uVar10._0_1_ = local_248[1].support_reserved_6;
                    uVar10._1_1_ = local_248[1].support_reserved_7;
                    uVar10._2_1_ = local_248[1].support_reserved_8;
                    uVar10._3_1_ = local_248[1].support_reserved_9;
                    uVar10._4_4_ = local_248[1].featmask;
                    plVar4 = (long *)local_248[1].type._M_string_length;
                    (**(code **)(*plVar4 + 0x18))(plVar4,uVar10);
                  }
                }
              }
              pLVar5[1].support_reserved_6 = false;
              pLVar5[1].support_reserved_7 = false;
              pLVar5[1].support_reserved_8 = false;
              pLVar5[1].support_reserved_9 = false;
              pLVar5[1].featmask = 0;
              *(undefined8 *)&pLVar5[1].typeindex = 0;
              *(undefined4 *)&pLVar5[1].type = 0;
              *(undefined4 *)&pLVar5[1].type.field_2 = 0;
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 4) = 0;
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 8) = 0;
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 0xc) = 0;
              *(undefined4 *)&pLVar5[1].name = 0;
              pLVar5[1].name._M_string_length = 0;
              pLVar5[1].userdata = (void *)0x0;
              *(void **)pbVar12 = *local_1a0;
              pLVar5[1].userdata = local_1a0[1];
              *(void **)&pLVar5[1].typeindex = local_1a0[2];
              *(undefined4 *)&pLVar5[1].type = *(undefined4 *)(local_1a0 + 3);
              pLVar5[1].type._M_string_length = (size_type)local_1a0[4];
              *(undefined4 *)&pLVar5[1].type.field_2 = *(undefined4 *)(local_1a0 + 5);
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 4) =
                   *(undefined4 *)((long)local_1a0 + 0x2c);
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 8) = *(undefined4 *)(local_1a0 + 6);
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 0xc) =
                   *(undefined4 *)((long)local_1a0 + 0x34);
              *(undefined4 *)&pLVar5[1].name = *(undefined4 *)(local_1a0 + 7);
              pLVar5[1].name._M_string_length = (size_type)local_1a0[8];
            }
            local_218 = &local_2a0;
            local_190 = pbVar12;
            local_50 = local_218;
            if (local_298 != (int *)0x0) {
              local_54 = 0xffffffff;
              LOCK();
              local_58 = *local_298;
              *local_298 = *local_298 + -1;
              UNLOCK();
              if (local_58 == 1) {
                if (local_280 == (long *)0x0) {
                  local_48 = local_2a0;
                  if (local_2a0 != (void *)0x0) {
                    free(local_2a0);
                  }
                }
                else {
                  (**(code **)(*local_280 + 0x18))(local_280,local_2a0);
                }
              }
            }
            local_2a0 = (void *)0x0;
            local_290 = 0;
            local_288 = 0;
            local_278 = 0;
            local_274 = 0;
            local_270 = 0;
            local_26c = 0;
            local_268 = 0;
            local_260 = 0;
            local_298 = (int *)0x0;
            local_e0 = &local_248[1].support_reserved_6;
            local_e8 = 0;
            **(undefined4 **)local_e0 = *(undefined4 *)&local_258[1]._vptr_Layer;
          }
          else {
            local_248[1].support_tensor_storage = true;
            local_248[1].support_reserved_00 = false;
            local_248[1].support_reserved_0 = false;
            local_248[1].support_reserved_1 = false;
          }
        }
        else {
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                  in_stack_fffffffffffffc08);
          if (bVar6) {
            local_2b8 = local_250;
            local_248[1].support_tensor_storage = true;
            local_248[1].support_reserved_00 = false;
            local_248[1].support_reserved_0 = false;
            local_248[1].support_reserved_1 = false;
            local_150 = &local_300;
            local_154 = 2;
            local_160 = 4;
            local_168 = 0;
            local_300 = (void *)0x0;
            local_2f8 = (int *)0x0;
            local_2f0 = 0;
            local_2e8 = 0;
            local_2e0 = (long *)0x0;
            local_2d8 = 0;
            local_2d4 = 0;
            local_2d0 = 0;
            local_2cc = 0;
            local_2c8 = 0;
            local_2c0 = 0;
            ncnn::Mat::create(in_stack_fffffffffffffc30,
                              (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                              (size_t)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            pLVar5 = local_248;
            pbVar12 = &local_248[1].support_reserved_6;
            local_1c0 = &local_300;
            local_1b8 = pbVar12;
            if ((void **)pbVar12 != local_1c0) {
              if (local_2f8 != (int *)0x0) {
                local_1c4 = 1;
                LOCK();
                local_1c8 = *local_2f8;
                *local_2f8 = *local_2f8 + 1;
                UNLOCK();
              }
              local_c0 = pbVar12;
              if (local_248[1].userdata != (void *)0x0) {
                piVar2 = (int *)local_248[1].userdata;
                local_c4 = 0xffffffff;
                LOCK();
                local_c8 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (local_c8 == 1) {
                  if (local_248[1].type._M_string_length == 0) {
                    local_10 = *(void **)pbVar12;
                    if (local_10 != (void *)0x0) {
                      free(local_10);
                    }
                  }
                  else {
                    uVar11._0_1_ = local_248[1].support_reserved_6;
                    uVar11._1_1_ = local_248[1].support_reserved_7;
                    uVar11._2_1_ = local_248[1].support_reserved_8;
                    uVar11._3_1_ = local_248[1].support_reserved_9;
                    uVar11._4_4_ = local_248[1].featmask;
                    plVar4 = (long *)local_248[1].type._M_string_length;
                    (**(code **)(*plVar4 + 0x18))(plVar4,uVar11);
                  }
                }
              }
              pLVar5[1].support_reserved_6 = false;
              pLVar5[1].support_reserved_7 = false;
              pLVar5[1].support_reserved_8 = false;
              pLVar5[1].support_reserved_9 = false;
              pLVar5[1].featmask = 0;
              *(undefined8 *)&pLVar5[1].typeindex = 0;
              *(undefined4 *)&pLVar5[1].type = 0;
              *(undefined4 *)&pLVar5[1].type.field_2 = 0;
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 4) = 0;
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 8) = 0;
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 0xc) = 0;
              *(undefined4 *)&pLVar5[1].name = 0;
              pLVar5[1].name._M_string_length = 0;
              pLVar5[1].userdata = (void *)0x0;
              *(void **)pbVar12 = *local_1c0;
              pLVar5[1].userdata = local_1c0[1];
              *(void **)&pLVar5[1].typeindex = local_1c0[2];
              *(undefined4 *)&pLVar5[1].type = *(undefined4 *)(local_1c0 + 3);
              pLVar5[1].type._M_string_length = (size_type)local_1c0[4];
              *(undefined4 *)&pLVar5[1].type.field_2 = *(undefined4 *)(local_1c0 + 5);
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 4) =
                   *(undefined4 *)((long)local_1c0 + 0x2c);
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 8) = *(undefined4 *)(local_1c0 + 6);
              *(undefined4 *)((long)&pLVar5[1].type.field_2 + 0xc) =
                   *(undefined4 *)((long)local_1c0 + 0x34);
              *(undefined4 *)&pLVar5[1].name = *(undefined4 *)(local_1c0 + 7);
              pLVar5[1].name._M_string_length = (size_type)local_1c0[8];
            }
            local_208 = &local_300;
            local_1b0 = pbVar12;
            local_70 = local_208;
            if (local_2f8 != (int *)0x0) {
              local_74 = 0xffffffff;
              LOCK();
              local_78 = *local_2f8;
              *local_2f8 = *local_2f8 + -1;
              UNLOCK();
              if (local_78 == 1) {
                if (local_2e0 == (long *)0x0) {
                  local_38 = local_300;
                  if (local_300 != (void *)0x0) {
                    free(local_300);
                  }
                }
                else {
                  (**(code **)(*local_2e0 + 0x18))(local_2e0,local_300);
                }
              }
            }
            local_300 = (void *)0x0;
            local_2f0 = 0;
            local_2e8 = 0;
            local_2d8 = 0;
            local_2d4 = 0;
            local_2d0 = 0;
            local_2cc = 0;
            local_2c8 = 0;
            local_2c0 = 0;
            local_2f8 = (int *)0x0;
            local_f0 = &local_248[1].support_reserved_6;
            local_f8 = 0;
            **(undefined4 **)local_f0 = *(undefined4 *)&local_2b8[1]._vptr_Layer;
            local_100 = &local_248[1].support_reserved_6;
            local_108 = 1;
            *(undefined4 *)(*(long *)local_100 + 4) =
                 *(undefined4 *)((long)&local_2b8[1]._vptr_Layer + 4);
          }
          else {
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                                    ,in_stack_fffffffffffffc08);
            if (bVar6) {
              local_248[1].support_tensor_storage = true;
              local_248[1].support_reserved_00 = false;
              local_248[1].support_reserved_0 = false;
              local_248[1].support_reserved_1 = false;
            }
            else {
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffc14,
                                                  in_stack_fffffffffffffc10),
                                      in_stack_fffffffffffffc08);
              if (bVar6) {
                local_248[1].support_tensor_storage = true;
                local_248[1].support_reserved_00 = false;
                local_248[1].support_reserved_0 = false;
                local_248[1].support_reserved_1 = false;
              }
              else {
                bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffc14,
                                                    in_stack_fffffffffffffc10),
                                        in_stack_fffffffffffffc08);
                if (bVar6) {
                  local_308 = local_250;
                  local_248[1].support_tensor_storage = true;
                  local_248[1].support_reserved_00 = false;
                  local_248[1].support_reserved_0 = false;
                  local_248[1].support_reserved_1 = false;
                  in_stack_fffffffffffffc30 = &local_350;
                  local_134 = 2;
                  local_140 = 4;
                  local_148 = 0;
                  local_350.data = (void *)0x0;
                  local_350.refcount = (int *)0x0;
                  local_350.elemsize = 0;
                  local_350.elempack = 0;
                  local_350.allocator = (Allocator *)0x0;
                  local_350.dims = 0;
                  local_350.w = 0;
                  local_350.h = 0;
                  local_350.d = 0;
                  local_350.c = 0;
                  local_350.cstep = 0;
                  local_130 = in_stack_fffffffffffffc30;
                  ncnn::Mat::create(in_stack_fffffffffffffc30,
                                    (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                                    (size_t)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
                  pLVar5 = local_248;
                  pbVar12 = &local_248[1].support_reserved_6;
                  local_1e0 = &local_350;
                  local_1d8 = pbVar12;
                  if ((Mat *)pbVar12 != local_1e0) {
                    if (local_350.refcount != (int *)0x0) {
                      local_1e4 = 1;
                      LOCK();
                      local_1e8 = *local_350.refcount;
                      *local_350.refcount = *local_350.refcount + 1;
                      UNLOCK();
                    }
                    in_stack_fffffffffffffc28 = pbVar12;
                    local_b0 = pbVar12;
                    if (local_248[1].userdata != (void *)0x0) {
                      piVar2 = (int *)local_248[1].userdata;
                      local_b4 = 0xffffffff;
                      LOCK();
                      local_b8 = *piVar2;
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (local_b8 == 1) {
                        if (local_248[1].type._M_string_length == 0) {
                          local_18 = *(void **)pbVar12;
                          if (local_18 != (void *)0x0) {
                            free(local_18);
                          }
                        }
                        else {
                          uVar3._0_1_ = local_248[1].support_reserved_6;
                          uVar3._1_1_ = local_248[1].support_reserved_7;
                          uVar3._2_1_ = local_248[1].support_reserved_8;
                          uVar3._3_1_ = local_248[1].support_reserved_9;
                          uVar3._4_4_ = local_248[1].featmask;
                          plVar4 = (long *)local_248[1].type._M_string_length;
                          (**(code **)(*plVar4 + 0x18))(plVar4,uVar3);
                        }
                      }
                    }
                    *(undefined8 *)in_stack_fffffffffffffc28 = 0;
                    *(undefined8 *)(in_stack_fffffffffffffc28 + 0x10) = 0;
                    *(undefined4 *)(in_stack_fffffffffffffc28 + 0x18) = 0;
                    *(undefined4 *)(in_stack_fffffffffffffc28 + 0x28) = 0;
                    *(undefined4 *)(in_stack_fffffffffffffc28 + 0x2c) = 0;
                    *(undefined4 *)(in_stack_fffffffffffffc28 + 0x30) = 0;
                    *(undefined4 *)(in_stack_fffffffffffffc28 + 0x34) = 0;
                    *(undefined4 *)(in_stack_fffffffffffffc28 + 0x38) = 0;
                    *(size_type *)(in_stack_fffffffffffffc28 + 0x40) = 0;
                    *(void **)(in_stack_fffffffffffffc28 + 8) = (void *)0x0;
                    *(void **)pbVar12 = local_1e0->data;
                    pLVar5[1].userdata = local_1e0->refcount;
                    *(size_t *)&pLVar5[1].typeindex = local_1e0->elemsize;
                    *(int *)&pLVar5[1].type = local_1e0->elempack;
                    pLVar5[1].type._M_string_length = (size_type)local_1e0->allocator;
                    *(int *)&pLVar5[1].type.field_2 = local_1e0->dims;
                    *(int *)((long)&pLVar5[1].type.field_2 + 4) = local_1e0->w;
                    *(int *)((long)&pLVar5[1].type.field_2 + 8) = local_1e0->h;
                    *(int *)((long)&pLVar5[1].type.field_2 + 0xc) = local_1e0->d;
                    *(int *)&pLVar5[1].name = local_1e0->c;
                    pLVar5[1].name._M_string_length = local_1e0->cstep;
                  }
                  in_stack_fffffffffffffc20 = &local_350;
                  local_1f8 = in_stack_fffffffffffffc20;
                  local_1d0 = pbVar12;
                  local_90 = in_stack_fffffffffffffc20;
                  if (local_350.refcount != (int *)0x0) {
                    local_94 = 0xffffffff;
                    LOCK();
                    local_98 = *local_350.refcount;
                    *local_350.refcount = *local_350.refcount + -1;
                    UNLOCK();
                    if (local_98 == 1) {
                      if (local_350.allocator == (Allocator *)0x0) {
                        local_28 = local_350.data;
                        if (local_350.data != (void *)0x0) {
                          free(local_350.data);
                        }
                      }
                      else {
                        (*(local_350.allocator)->_vptr_Allocator[3])
                                  (local_350.allocator,local_350.data);
                      }
                    }
                  }
                  in_stack_fffffffffffffc20->data = (void *)0x0;
                  in_stack_fffffffffffffc20->elemsize = 0;
                  in_stack_fffffffffffffc20->elempack = 0;
                  in_stack_fffffffffffffc20->dims = 0;
                  in_stack_fffffffffffffc20->w = 0;
                  in_stack_fffffffffffffc20->h = 0;
                  in_stack_fffffffffffffc20->d = 0;
                  in_stack_fffffffffffffc20->c = 0;
                  in_stack_fffffffffffffc20->cstep = 0;
                  in_stack_fffffffffffffc20->refcount = (int *)0x0;
                  local_110 = &local_248[1].support_reserved_6;
                  local_118 = 0;
                  **(undefined4 **)local_110 = *(undefined4 *)&local_308[1]._vptr_Layer;
                  local_120 = &local_248[1].support_reserved_6;
                  local_128 = 1;
                  *(undefined4 *)(*(long *)local_120 + 4) =
                       *(undefined4 *)((long)&local_308[1]._vptr_Layer + 4);
                }
              }
            }
          }
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_250->tops,0);
        iVar1 = *pvVar8;
        in_stack_fffffffffffffc10 = iVar1;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_248->tops,0);
        *pvVar8 = in_stack_fffffffffffffc10;
        in_stack_fffffffffffffc14 = (int)local_230;
        pvVar13 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             (long)iVar1);
        pvVar13->producer = in_stack_fffffffffffffc14;
        std::__cxx11::string::operator=((string *)&local_250->type,"ncnnfused");
      }
    }
    local_230 = local_230 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - Activation to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_innerproduct_activation %s %s\n", innerproduct->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                innerproduct->activation_type = 1;
            }
            else
            {
                innerproduct->activation_type = 2;
                innerproduct->activation_params = ncnn::Mat(1);
                innerproduct->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            innerproduct->activation_type = 3;
            innerproduct->activation_params = ncnn::Mat(2);
            innerproduct->activation_params[0] = clip->min;
            innerproduct->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            innerproduct->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            innerproduct->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            innerproduct->activation_type = 6;
            innerproduct->activation_params = ncnn::Mat(2);
            innerproduct->activation_params[0] = hardswish->alpha;
            innerproduct->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}